

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInputMessageContent(TgTypeParser *this,ptree *data)

{
  ulong uVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  type_conflict3 tVar3;
  Ptr PVar4;
  shared_ptr<TgBot::InputContactMessageContent> local_270;
  shared_ptr<TgBot::InputContactMessageContent> local_260;
  shared_ptr<TgBot::InputLocationMessageContent> local_250;
  shared_ptr<TgBot::InputLocationMessageContent> local_240;
  shared_ptr<TgBot::InputVenueMessageContent> local_230;
  shared_ptr<TgBot::InputMessageContent> local_220;
  shared_ptr<TgBot::InputTextMessageContent> local_210;
  shared_ptr<TgBot::InputMessageContent> local_200;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_190 [8];
  string tPnoneNumber;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_110 [8];
  string tTitle;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  type_conflict3 local_b8;
  allocator local_b1;
  float tLatitude;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_48 [8];
  string tMessageText;
  ptree *data_local;
  TgTypeParser *this_local;
  Ptr *result;
  
  tMessageText.field_2._M_local_buf[0xf] = '\0';
  std::shared_ptr<TgBot::InputMessageContent>::shared_ptr
            ((shared_ptr<TgBot::InputMessageContent> *)this);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_78,"message_text",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&tLatitude,"",&local_b1);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            ((type *)local_48,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tLatitude);
  std::__cxx11::string::~string((string *)&tLatitude);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_78);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_e8,"latitude",0x2e);
  tTitle.field_2._8_4_ = 0x447a0000;
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(in_RDX,&local_e8,(float *)((long)&tTitle.field_2 + 8));
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_e8);
  local_b8 = tVar3;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_140,"title",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"",(allocator *)(tPnoneNumber.field_2._M_local_buf + 0xf));
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            ((type *)local_110,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_140,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)(tPnoneNumber.field_2._M_local_buf + 0xf));
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_140);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_1c0,"phone_number",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            ((type *)local_190,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_1c0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    parseJsonAndGetInputTextMessageContent((TgTypeParser *)&local_210,data);
    std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputTextMessageContent>
              ((shared_ptr<TgBot::InputTextMessageContent> *)&local_200);
    std::shared_ptr<TgBot::InputMessageContent>::operator=
              ((shared_ptr<TgBot::InputMessageContent> *)this,&local_200);
    std::shared_ptr<TgBot::InputMessageContent>::~shared_ptr(&local_200);
    std::shared_ptr<TgBot::InputTextMessageContent>::~shared_ptr(&local_210);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      parseJsonAndGetInputVenueMessageContent((TgTypeParser *)&local_230,data);
      std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputVenueMessageContent>
                ((shared_ptr<TgBot::InputVenueMessageContent> *)&local_220);
      std::shared_ptr<TgBot::InputMessageContent>::operator=
                ((shared_ptr<TgBot::InputMessageContent> *)this,&local_220);
      std::shared_ptr<TgBot::InputMessageContent>::~shared_ptr(&local_220);
      std::shared_ptr<TgBot::InputVenueMessageContent>::~shared_ptr(&local_230);
    }
    else if ((local_b8 != 1000.0) || (NAN(local_b8))) {
      parseJsonAndGetInputLocationMessageContent((TgTypeParser *)&local_250,data);
      std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputLocationMessageContent>
                (&local_240);
      std::shared_ptr<TgBot::InputMessageContent>::operator=
                ((shared_ptr<TgBot::InputMessageContent> *)this,
                 (shared_ptr<TgBot::InputMessageContent> *)&local_240);
      std::shared_ptr<TgBot::InputMessageContent>::~shared_ptr
                ((shared_ptr<TgBot::InputMessageContent> *)&local_240);
      std::shared_ptr<TgBot::InputLocationMessageContent>::~shared_ptr(&local_250);
    }
    else {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        parseJsonAndGetInputContactMessageContent((TgTypeParser *)&local_270,data);
        std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputContactMessageContent>
                  (&local_260);
        std::shared_ptr<TgBot::InputMessageContent>::operator=
                  ((shared_ptr<TgBot::InputMessageContent> *)this,
                   (shared_ptr<TgBot::InputMessageContent> *)&local_260);
        std::shared_ptr<TgBot::InputMessageContent>::~shared_ptr
                  ((shared_ptr<TgBot::InputMessageContent> *)&local_260);
        std::shared_ptr<TgBot::InputContactMessageContent>::~shared_ptr(&local_270);
      }
    }
  }
  tMessageText.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_48);
  _Var2._M_pi = extraout_RDX;
  if ((tMessageText.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::shared_ptr<TgBot::InputMessageContent>::~shared_ptr
              ((shared_ptr<TgBot::InputMessageContent> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  PVar4.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InputMessageContent::Ptr TgTypeParser::parseJsonAndGetInputMessageContent(const boost::property_tree::ptree& data) const {
    InputMessageContent::Ptr result;
    // define InputMessageContent type

    string tMessageText = data.get<string>("message_text", "");
    float tLatitude = data.get<float>("latitude", 1000); // latitude belong (-90,90)
    string tTitle = data.get<string>("title", "");
    string tPnoneNumber = data.get<string>("phone_number", "");

    if (!tMessageText.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputTextMessageContent(data));
    } else if (!tTitle.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputVenueMessageContent(data));
    } else if (tLatitude != 1000) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputLocationMessageContent(data));
    } else if (!tPnoneNumber.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputContactMessageContent(data));
    }

    return result;
}